

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-decompile.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  wabt *this;
  string *callback;
  ReadBinaryOptions *options_00;
  int iVar3;
  string_view filename;
  string_view filename_00;
  bool fail_on_custom_section_error;
  DecompileOptions decompile_options;
  undefined1 local_57b [19];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ReadBinaryOptions options;
  string outfile;
  string infile;
  Errors errors;
  string s;
  OptionParser parser;
  ValidateOptions options_1;
  char s_description [208];
  
  wabt::InitStdio();
  infile._M_dataplus._M_p = (pointer)&infile.field_2;
  infile._M_string_length = 0;
  infile.field_2._M_local_buf[0] = '\0';
  outfile._M_dataplus._M_p = (pointer)&outfile.field_2;
  outfile._M_string_length = 0;
  outfile.field_2._M_local_buf[0] = '\0';
  local_57b[0] = false;
  local_57b[1] = true;
  local_57b[2] = true;
  local_57b[3] = true;
  local_57b[4] = true;
  local_57b[5] = false;
  local_57b[6] = false;
  local_57b[7] = true;
  local_57b[8] = false;
  local_57b[9] = true;
  local_57b[10] = true;
  local_57b[0xb] = false;
  local_57b[0xc] = false;
  local_57b[0xd] = false;
  local_57b[0xe] = false;
  local_57b._15_4_ = 0;
  fail_on_custom_section_error = true;
  memcpy(s_description,
         "  Read a file in the WebAssembly binary format, and convert it to\n  a decompiled text file.\n\nexamples:\n  # parse binary file test.wasm and write text file test.dcmp\n  $ wasm-decompile test.wasm -o test.dcmp\n"
         ,0xd0);
  wabt::OptionParser::OptionParser(&parser,"wasm-decompile",s_description);
  options.features.tail_call_enabled_ = false;
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.code_metadata_enabled_ = false;
  options.features.gc_enabled_ = false;
  options.features.memory64_enabled_ = false;
  options.features._0_8_ = &outfile;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:58:9)>
       ::_M_invoke;
  options.features.multi_memory_enabled_ = false;
  options.features.extended_const_enabled_ = true;
  options.features.relaxed_simd_enabled_ = true;
  options.features.custom_page_sizes_enabled_ = true;
  options._19_5_ = 0;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILENAME",
             "Output file for the decompiled file, by default use stdout",(Callback *)&options);
  if ((code *)CONCAT53(options._19_5_,options.features._16_3_) != (code *)0x0) {
    (*(code *)CONCAT53(options._19_5_,options.features._16_3_))(&options,&options,3);
  }
  wabt::Features::AddOptions((Features *)local_57b,&parser);
  options.features.tail_call_enabled_ = false;
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.code_metadata_enabled_ = false;
  options.features.gc_enabled_ = false;
  options.features.memory64_enabled_ = false;
  options.features._0_8_ = &fail_on_custom_section_error;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:65:22)>
       ::_M_invoke;
  options.features.multi_memory_enabled_ = false;
  options.features.extended_const_enabled_ = true;
  options.features.relaxed_simd_enabled_ = true;
  options.features.custom_page_sizes_enabled_ = true;
  options._19_5_ = 0;
  wabt::OptionParser::AddOption
            (&parser,"ignore-custom-section-errors","Ignore errors in custom sections",
             (NullCallback *)&options);
  if ((code *)CONCAT53(options._19_5_,options.features._16_3_) != (code *)0x0) {
    (*(code *)CONCAT53(options._19_5_,options.features._16_3_))(&options,&options,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options,"filename",(allocator<char> *)&file_data);
  callback = &s;
  s._M_string_length = 0;
  s._M_dataplus._M_p = (pointer)&infile;
  s.field_2._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:67:24)>
       ::_M_invoke;
  s.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-decompile.cc:67:24)>
       ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&options,One,(Callback *)callback);
  if (s.field_2._M_allocated_capacity != 0) {
    (*(code *)s.field_2._M_allocated_capacity)(&s,&s,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  _Var1 = infile._M_dataplus;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(infile._M_dataplus._M_p);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  if (RVar2.enum_ != Ok) {
    iVar3 = 1;
    goto LAB_001138e6;
  }
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::Module::Module((Module *)s_description);
  options.features._1_7_ = local_57b._1_7_;
  options.features.exceptions_enabled_ = local_57b[0];
  options.features._9_2_ = local_57b._9_2_;
  options.features.tail_call_enabled_ = local_57b[8];
  options.features._11_4_ = local_57b._11_4_;
  options_00 = &options;
  options.features.multi_memory_enabled_ = (bool)local_57b[0xf];
  options.features.extended_const_enabled_ = (bool)local_57b[0x10];
  options.features.relaxed_simd_enabled_ = (bool)local_57b[0x11];
  options.features.custom_page_sizes_enabled_ = (bool)local_57b[0x12];
  options.log_stream = (Stream *)0x0;
  options.read_debug_names = true;
  options.stop_on_first_error = true;
  options.fail_on_custom_section_error = fail_on_custom_section_error;
  options.skip_function_bodies = false;
  RVar2 = wabt::ReadBinaryIr(infile._M_dataplus._M_p,
                             file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)file_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)file_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,options_00,&errors,
                             (Module *)s_description);
  if (RVar2.enum_ == Ok) {
    options_1.features._1_7_ = local_57b._1_7_;
    options_1.features.exceptions_enabled_ = local_57b[0];
    options_1.features._9_2_ = local_57b._9_2_;
    options_1.features.tail_call_enabled_ = local_57b[8];
    options_1.features._11_4_ = local_57b._11_4_;
    options_1.features.multi_memory_enabled_ = (bool)local_57b[0xf];
    options_1.features.extended_const_enabled_ = (bool)local_57b[0x10];
    options_1.features.relaxed_simd_enabled_ = (bool)local_57b[0x11];
    options_1.features.custom_page_sizes_enabled_ = (bool)local_57b[0x12];
    RVar2 = wabt::ValidateModule((Module *)s_description,&errors,&options_1);
    if (RVar2.enum_ != Ok) goto LAB_0011387e;
    iVar3 = 1;
    RVar2 = wabt::GenerateNames((Module *)s_description,AlphaNames);
    if (RVar2.enum_ == Ok) {
      wabt::RenameAll((Module *)s_description);
      wabt::ApplyNames((Module *)s_description);
      wabt::Decompile_abi_cxx11_
                (&s,(wabt *)s_description,(Module *)&decompile_options,
                 (DecompileOptions *)options_00);
      if (outfile._M_string_length == 0) {
        wabt::FileStream::FileStream((FileStream *)&parser,_stdout,(Stream *)0x0);
      }
      else {
        filename_00._M_str = outfile._M_dataplus._M_p;
        filename_00._M_len = outfile._M_string_length;
        wabt::FileStream::FileStream((FileStream *)&parser,filename_00,(Stream *)0x0);
      }
      iVar3 = 0;
      wabt::Stream::WriteData
                ((Stream *)&parser,s._M_dataplus._M_p,s._M_string_length,(char *)0x0,No);
      wabt::FileStream::~FileStream((FileStream *)&parser);
      std::__cxx11::string::_M_dispose();
    }
  }
  else {
LAB_0011387e:
    iVar3 = 1;
  }
  parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
  parser.program_name_._M_string_length = 0;
  parser.program_name_.field_2._M_local_buf[0] = '\0';
  wabt::FormatErrorsToFile
            (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,&parser.program_name_,Never,0x50);
  std::__cxx11::string::_M_dispose();
  wabt::Module::~Module((Module *)s_description);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
LAB_001138e6:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return iVar3;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  std::string infile;
  std::string outfile;
  Features features;
  DecompileOptions decompile_options;
  bool fail_on_custom_section_error = true;

  {
    const char s_description[] =
        "  Read a file in the WebAssembly binary format, and convert it to\n"
        "  a decompiled text file.\n"
        "\n"
        "examples:\n"
        "  # parse binary file test.wasm and write text file test.dcmp\n"
        "  $ wasm-decompile test.wasm -o test.dcmp\n";
    OptionParser parser("wasm-decompile", s_description);
    parser.AddOption(
        'o', "output", "FILENAME",
        "Output file for the decompiled file, by default use stdout",
        [&](const char* argument) {
          outfile = argument;
          ConvertBackslashToSlash(&outfile);
        });
    features.AddOptions(&parser);
    parser.AddOption("ignore-custom-section-errors",
                     "Ignore errors in custom sections",
                     [&]() { fail_on_custom_section_error = false; });
    parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                       [&](const char* argument) {
                         infile = argument;
                         ConvertBackslashToSlash(&infile);
                       });
    parser.Parse(argc, argv);
  }

  std::vector<uint8_t> file_data;
  Result result = ReadFile(infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(features, nullptr, true, kStopOnFirstError,
                              fail_on_custom_section_error);
    result = ReadBinaryIr(infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      ValidateOptions options(features);
      result = ValidateModule(&module, &errors, options);
      if (Succeeded(result)) {
        result =
            GenerateNames(&module, static_cast<NameOpts>(NameOpts::AlphaNames));
      }
      if (Succeeded(result)) {
        // Must be called after ReadBinaryIr & GenerateNames, and before
        // ApplyNames, see comments at definition.
        RenameAll(module);
      }
      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }
      if (Succeeded(result)) {
        auto s = Decompile(module, decompile_options);
        FileStream stream(!outfile.empty() ? FileStream(outfile)
                                           : FileStream(stdout));
        stream.WriteData(s.data(), s.size());
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}